

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void large_batch_write_no_commit_test(void)

{
  void *pvVar1;
  fdb_status fVar2;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  char *__format;
  ulong uVar3;
  long lVar4;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  char metabuf [256];
  fdb_file_handle *local_478;
  void *local_470;
  fdb_kvs_handle *local_468;
  fdb_kvs_config local_460;
  timeval local_448;
  char local_438 [256];
  char local_338 [264];
  fdb_config local_230;
  char local_138 [264];
  
  gettimeofday(&local_448,(__timezone_ptr_t)0x0);
  memleak_start();
  local_470 = malloc(4000000);
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(&local_478,"./dummy1",&local_230);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x304);
    large_batch_write_no_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x304,"void large_batch_write_no_commit_test()");
  }
  fVar2 = fdb_kvs_open(local_478,&local_468,(char *)0x0,&local_460);
  pvVar1 = local_470;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x306);
    large_batch_write_no_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x306,"void large_batch_write_no_commit_test()");
  }
  lVar4 = 0;
  for (uVar3 = 0; uVar3 != 500000; uVar3 = uVar3 + 1) {
    sprintf(local_338,"key%128d",uVar3 & 0xffffffff);
    sprintf(local_138,"meta%128d",uVar3 & 0xffffffff);
    sprintf(local_438,"body%128d",uVar3 & 0xffffffff);
    keylen = strlen(local_338);
    metalen = strlen(local_138);
    bodylen = strlen(local_438);
    fdb_doc_create((fdb_doc **)((long)pvVar1 + lVar4),local_338,keylen,local_138,metalen,local_438,
                   bodylen);
    fdb_set(local_468,*(fdb_doc **)((long)pvVar1 + uVar3 * 8));
    fdb_doc_free(*(fdb_doc **)((long)pvVar1 + uVar3 * 8));
    lVar4 = lVar4 + 8;
  }
  fVar2 = fdb_kvs_close(local_468);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x315);
    large_batch_write_no_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x315,"void large_batch_write_no_commit_test()");
  }
  fVar2 = fdb_close(local_478);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x317);
    large_batch_write_no_commit_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x317,"void large_batch_write_no_commit_test()");
  }
  fVar2 = fdb_open(&local_478,"./dummy1",&local_230);
  if (fVar2 != FDB_RESULT_NO_DB_HEADERS) {
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x31b);
      large_batch_write_no_commit_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_NO_DB_HEADERS || status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x31b,"void large_batch_write_no_commit_test()");
    }
    fVar2 = fdb_close(local_478);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x31e);
      large_batch_write_no_commit_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x31e,"void large_batch_write_no_commit_test()");
    }
  }
  free(local_470);
  fdb_shutdown();
  memleak_end();
  __format = "%s PASSED\n";
  if (large_batch_write_no_commit_test()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"large batch write test with no commits");
  return;
}

Assistant:

void large_batch_write_no_commit_test()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 500000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = (fdb_doc **) malloc(sizeof(fdb_doc *) * n);
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], metabuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Write 500K docs to eject and flush some dirty pages into disk.
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%128d", i);
        sprintf(metabuf, "meta%128d", i);
        sprintf(bodybuf, "body%128d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }

    // close without commit
    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_DB_HEADERS ||
             status == FDB_RESULT_SUCCESS); // No dirty pages are flushed into disk.
    if (status == FDB_RESULT_SUCCESS) {
        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    free(doc);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("large batch write test with no commits");
}